

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQInteger *nparams,SQInteger *nfreevars)

{
  SQClosure *pSVar1;
  SQFunctionProto *pSVar2;
  SQObjectPtr *pSVar3;
  SQInteger *in_RCX;
  SQInteger *in_RDX;
  SQNativeClosure *c_1;
  SQFunctionProto *proto;
  SQClosure *c;
  SQObject o;
  SQChar *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  int local_38;
  SQRESULT local_8;
  
  pSVar3 = stack_get(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  pSVar1 = (pSVar3->super_SQObject)._unVal.pClosure;
  local_38 = (int)*(undefined8 *)&pSVar3->super_SQObject;
  if (local_38 == 0x8000100) {
    pSVar2 = pSVar1->_function;
    *in_RDX = pSVar2->_nparameters;
    *in_RCX = pSVar2->_noutervalues;
    local_8 = 0;
  }
  else if (local_38 == 0x8000200) {
    *in_RDX = (SQInteger)pSVar1->_env;
    *in_RCX = (SQInteger)pSVar1->_defaultparams;
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_getclosureinfo(HSQUIRRELVM v,SQInteger idx,SQInteger *nparams,SQInteger *nfreevars)
{
    SQObject o = stack_get(v, idx);
    if(sq_type(o) == OT_CLOSURE) {
        SQClosure *c = _closure(o);
        SQFunctionProto *proto = c->_function;
        *nparams = proto->_nparameters;
        *nfreevars = proto->_noutervalues;
        return SQ_OK;
    }
    else if(sq_type(o) == OT_NATIVECLOSURE)
    {
        SQNativeClosure *c = _nativeclosure(o);
        *nparams = c->_nparamscheck;
        *nfreevars = (SQInteger)c->_noutervalues;
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("the object is not a closure"));
}